

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void trieste::logging::append<char[16]>(Log *self,char (*t) [16])

{
  bool bVar1;
  runtime_error *this;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char (*t_local) [16];
  Log *self_local;
  
  bVar1 = Log::is_active(self);
  if (!bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Log should not be printed! Use should_print()");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar2 = detail::
           UnsafeInit<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get(&self->strstream);
  std::operator<<((ostream *)&pbVar2->field_0x10,*t);
  return;
}

Assistant:

inline SNMALLOC_SLOW_PATH void append(Log& self, const T& t)
  {
    self.get_stringstream() << t;
  }